

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::MergeFromImpl<false>
          (internal *this,string_view input,MessageLite *msg,TcParseTableBase *tc_table,
          ParseFlags parse_flags)

{
  undefined8 *puVar1;
  ParseContext *pPVar2;
  MessageFactory *p;
  MessageLite *pMVar3;
  bool bVar4;
  unsigned_short uVar5;
  int depth;
  uint32_t uVar6;
  TcParseTableBase *this_00;
  TailCallParseFunc p_Var7;
  TcParseTableBase *pTVar8;
  bool local_151;
  undefined1 local_138 [8];
  ParseContext ctx;
  char *ptr;
  ParseFlags parse_flags_local;
  TcParseTableBase *tc_table_local;
  MessageLite *msg_local;
  string_view input_local;
  TcFieldData local_90;
  TcParseTableBase *local_88;
  ParseContext *local_80;
  MessageFactory *local_78;
  MessageLite *local_70;
  MessageFactory *local_68;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_60;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_58;
  TcFieldData data;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  
  input_local._M_len = input._M_len;
  msg_local = (MessageLite *)this;
  depth = io::CodedInputStream::GetDefaultRecursionLimit();
  ParseContext::ParseContext<std::basic_string_view<char,std::char_traits<char>>&>
            ((ParseContext *)local_138,depth,false,(char **)&ctx.data_.factory,
             (basic_string_view<char,_std::char_traits<char>_> *)&msg_local);
  local_78 = ctx.data_.factory;
  local_80 = (ParseContext *)local_138;
  local_88 = (TcParseTableBase *)&msg[3]._internal_metadata_;
  local_70 = (MessageLite *)input._M_str;
  while (bVar4 = ParseContext::Done(local_80,(char **)&local_78), pMVar3 = local_70, p = local_78,
        pPVar2 = local_80, ((bVar4 ^ 0xffU) & 1) != 0) {
    TcFieldData::TcFieldData(&local_90);
    pTVar8 = local_88;
    this_00 = (TcParseTableBase *)((long)local_88 + -0x38);
    uVar5 = UnalignedLoad<unsigned_short>((char *)p);
    if (((long)(int)((uint)uVar5 & (uint)*(byte *)((long)pTVar8 + -0x30)) & 7U) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   TcParseTableBase::fast_entry
                             (this_00,(ulong)(long)(int)((uint)uVar5 &
                                                        (uint)*(byte *)((long)pTVar8 + -0x30)) >> 3)
    ;
    local_58.data =
         (ulong)uVar5 ^
         ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data.field_0 + 8))->data;
    p_Var7 = TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data.field_0);
    local_60.data = local_58.data;
    local_78 = (MessageFactory *)(*p_Var7)(pMVar3,(char *)p,pPVar2,(TcFieldData)local_58,this_00,0);
    if ((local_78 == (MessageFactory *)0x0) ||
       (uVar6 = EpsCopyInputStream::LastTag(&local_80->super_EpsCopyInputStream), uVar6 != 1))
    break;
  }
  pTVar8 = (TcParseTableBase *)((long)local_88 + -0x38);
  if ((*(byte *)((long)local_88 + -0x30 + 1) & 1) == 0) {
    local_88 = pTVar8;
    if (local_78 == (MessageFactory *)0x0) {
      TcParser::VerifyHasBitConsistency(local_70,pTVar8);
    }
    local_68 = local_78;
  }
  else {
    puVar1 = (undefined8 *)((long)local_88 + -0x10);
    local_88 = pTVar8;
    local_68 = (MessageFactory *)(*(code *)*puVar1)(local_70,local_78,local_80);
  }
  ctx.data_.factory = local_68;
  local_151 = false;
  if (local_68 != (MessageFactory *)0x0) {
    local_151 = EpsCopyInputStream::EndedAtLimit((EpsCopyInputStream *)local_138);
  }
  if (local_151 == false) {
    input_local._M_str._7_1_ = false;
  }
  else {
    input_local._M_str._7_1_ =
         anon_unknown_15::CheckFieldPresence
                   ((ParseContext *)local_138,(MessageLite *)input._M_str,(ParseFlags)tc_table);
  }
  return input_local._M_str._7_1_;
}

Assistant:

bool MergeFromImpl(absl::string_view input, MessageLite* msg,
                   const internal::TcParseTableBase* tc_table,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input);
  ptr = internal::TcParser::ParseLoop(msg, ptr, &ctx, tc_table);
  // ctx has an explicit limit set (length of string_view).
  if (ABSL_PREDICT_TRUE(ptr && ctx.EndedAtLimit())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}